

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver,int event_type,QThreadData *data)

{
  int *piVar1;
  qsizetype *pqVar2;
  QAtomicInt *pQVar3;
  QEvent *event;
  QObject *receiver_00;
  long lVar4;
  QPostEvent *pQVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  QPostEvent local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [25];
  uint7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  if (event_type != -1) {
    uVar6 = event_type;
  }
  if ((receiver != (QObject *)0x0) && ((QThreadData *)(receiver->d_ptr).d[1].q_ptr != data)) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    stack0xffffffffffffffc0 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)local_58,
               "QCoreApplication::sendPostedEvents: Cannot send posted events for objects in another thread"
              );
    goto LAB_00256626;
  }
  piVar1 = &(data->postEventList).recursion;
  *piVar1 = *piVar1 + 1;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_lock<QMutex>::unique_lock
            ((unique_lock<QMutex> *)local_68,&(data->postEventList).mutex);
  lVar4 = (data->postEventList).super_QList<QPostEvent>.d.size;
  data->canWait = lVar4 == 0;
  if (lVar4 != 0) {
    if (receiver == (QObject *)0x0) {
LAB_00256438:
      bVar10 = receiver == (QObject *)0x0;
      data->canWait = true;
      qVar9 = (data->postEventList).startOffset;
      bVar11 = uVar6 == 0;
      (data->postEventList).insertionOffset = lVar4;
      local_58._12_4_ = 0xaaaaaaaa;
      local_58[0x18] = true;
      uStack_3f = 0xaaaaaaaaaaaaaa;
      local_58._8_4_ = uVar6;
      local_58._0_8_ = receiver;
      local_58._16_8_ = data;
LAB_0025649e:
      if (bVar11 && bVar10) {
        lVar4 = (data->postEventList).startOffset;
        if ((data->postEventList).super_QList<QPostEvent>.d.size <= lVar4) goto LAB_0025660e;
      }
      else {
        lVar4 = qVar9;
        if ((data->postEventList).super_QList<QPostEvent>.d.size <= qVar9) goto LAB_0025660e;
      }
      if ((data->postEventList).insertionOffset <= lVar4) goto LAB_0025660e;
      if (bVar11 && bVar10) {
        pqVar2 = &(data->postEventList).startOffset;
        *pqVar2 = *pqVar2 + 1;
      }
      else {
        qVar9 = qVar9 + 1;
      }
      pQVar5 = (data->postEventList).super_QList<QPostEvent>.d.ptr + lVar4;
      event = pQVar5->event;
      if (event != (QEvent *)0x0) {
        receiver_00 = pQVar5->receiver;
        if (((receiver == (QObject *)0x0) || (receiver_00 == receiver)) &&
           ((uVar6 == 0 || (uVar6 == event->t)))) {
          if (event->t == 0x34) {
            iVar7 = *(int *)((long)&event[1]._vptr_QEvent + 4) + *(int *)&event[1]._vptr_QEvent;
            iVar8 = data->scopeLevel + data->loopLevel;
            if (iVar7 <= iVar8) {
              if ((*(int *)&event[1]._vptr_QEvent != 0 || data->loopLevel < 1) &&
                 (iVar7 != iVar8 || uVar6 != 0x34)) {
                if (bVar11 && bVar10) {
                  local_88.receiver = pQVar5->receiver;
                  local_88.event = pQVar5->event;
                  local_88.priority = pQVar5->priority;
                  local_88._20_4_ = *(undefined4 *)&pQVar5->field_0x14;
                  pQVar5->event = (QEvent *)0x0;
                  QPostEventList::addEvent(&data->postEventList,&local_88);
                }
                goto LAB_0025649e;
              }
            }
          }
          event->m_posted = false;
          LOCK();
          pQVar3 = &((receiver_00->d_ptr).d)->postedEvents;
          (pQVar3->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar3->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pQVar5->event = (QEvent *)0x0;
          std::unique_lock<QMutex>::unlock((unique_lock<QMutex> *)local_68);
          local_88.event = (QEvent *)0xaaaaaaaaaaaaaa01;
          local_88.receiver = (QObject *)local_68;
          QCoreApplication::sendEvent(receiver_00,event);
          (*event->_vptr_QEvent[1])(event);
          QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qcoreapplication.cpp:1885:43)>
          ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_kernel_qcoreapplication_cpp:1885:43)>
                          *)&local_88);
          goto LAB_0025649e;
        }
        data->canWait = false;
      }
      goto LAB_0025649e;
    }
    if ((((receiver->d_ptr).d)->postedEvents).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 0) {
      lVar4 = (data->postEventList).super_QList<QPostEvent>.d.size;
      goto LAB_00256438;
    }
  }
  piVar1 = &(data->postEventList).recursion;
  *piVar1 = *piVar1 + -1;
LAB_0025661c:
  std::unique_lock<QMutex>::~unique_lock((unique_lock<QMutex> *)local_68);
LAB_00256626:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_0025660e:
  stack0xffffffffffffffc0 = (char *)((ulong)uStack_3f << 8);
  sendPostedEvents::CleanUp::~CleanUp((CleanUp *)local_58);
  goto LAB_0025661c;
}

Assistant:

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver, int event_type,
                                               QThreadData *data)
{
    if (event_type == -1) {
        // we were called by an obsolete event dispatcher.
        event_type = 0;
    }

    if (receiver && receiver->d_func()->threadData.loadRelaxed() != data) {
        qWarning("QCoreApplication::sendPostedEvents: Cannot send "
                 "posted events for objects in another thread");
        return;
    }

    ++data->postEventList.recursion;

    auto locker = qt_unique_lock(data->postEventList.mutex);

    // by default, we assume that the event dispatcher can go to sleep after
    // processing all events. if any new events are posted while we send
    // events, canWait will be set to false.
    data->canWait = (data->postEventList.size() == 0);

    if (data->postEventList.size() == 0
            || (receiver && !receiver->d_func()->postedEvents.loadAcquire())) {
        --data->postEventList.recursion;
        return;
    }

    data->canWait = true;

    // okay. here is the tricky loop. be careful about optimizing
    // this, it looks the way it does for good reasons.
    qsizetype startOffset = data->postEventList.startOffset;
    qsizetype &i = (!event_type && !receiver) ? data->postEventList.startOffset : startOffset;
    data->postEventList.insertionOffset = data->postEventList.size();

    // Exception-safe cleaning up without the need for a try/catch block
    struct CleanUp {
        Q_DISABLE_COPY_MOVE(CleanUp)

        QObject *receiver;
        int event_type;
        QThreadData *data;
        bool exceptionCaught;

        inline CleanUp(QObject *receiver, int event_type, QThreadData *data) :
            receiver(receiver), event_type(event_type), data(data), exceptionCaught(true)
        {}
        inline ~CleanUp()
        {
            if (exceptionCaught) {
                // since we were interrupted, we need another pass to make sure we clean everything up
                data->canWait = false;
            }

            --data->postEventList.recursion;
            if (!data->postEventList.recursion && !data->canWait && data->hasEventDispatcher())
                data->eventDispatcher.loadRelaxed()->wakeUp();

            // clear the global list, i.e. remove everything that was
            // delivered.
            if (!event_type && !receiver && data->postEventList.startOffset >= 0) {
                const QPostEventList::iterator it = data->postEventList.begin();
                data->postEventList.erase(it, it + data->postEventList.startOffset);
                data->postEventList.insertionOffset -= data->postEventList.startOffset;
                Q_ASSERT(data->postEventList.insertionOffset >= 0);
                data->postEventList.startOffset = 0;
            }
        }
    };
    CleanUp cleanup(receiver, event_type, data);

    while (i < data->postEventList.size()) {
        // avoid live-lock
        if (i >= data->postEventList.insertionOffset)
            break;

        const QPostEvent &pe = data->postEventList.at(i);
        ++i;

        if (!pe.event)
            continue;
        if ((receiver && receiver != pe.receiver) || (event_type && event_type != pe.event->type())) {
            data->canWait = false;
            continue;
        }

        if (pe.event->type() == QEvent::DeferredDelete) {
            // DeferredDelete events are sent either
            // 1) when the event loop that posted the event has returned; or
            // 2) if explicitly requested (with QEvent::DeferredDelete) for
            //    events posted by the current event loop; or
            // 3) if the event was posted before the outermost event loop.

            const int eventLoopLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->loopLevel();
            const int eventScopeLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->scopeLevel();

            const bool postedBeforeOutermostLoop = eventLoopLevel == 0;
            const bool allowDeferredDelete =
                (eventLoopLevel + eventScopeLevel > data->loopLevel + data->scopeLevel
                 || (postedBeforeOutermostLoop && data->loopLevel > 0)
                 || (event_type == QEvent::DeferredDelete
                     && eventLoopLevel + eventScopeLevel == data->loopLevel + data->scopeLevel));
            if (!allowDeferredDelete) {
                // cannot send deferred delete
                if (!event_type && !receiver) {
                    // we must copy it first; we want to re-post the event
                    // with the event pointer intact, but we can't delay
                    // nulling the event ptr until after re-posting, as
                    // addEvent may invalidate pe.
                    QPostEvent pe_copy = pe;

                    // null out the event so if sendPostedEvents recurses, it
                    // will ignore this one, as it's been re-posted.
                    const_cast<QPostEvent &>(pe).event = nullptr;

                    // re-post the copied event so it isn't lost
                    data->postEventList.addEvent(pe_copy);
                }
                continue;
            }
        }

        // first, we diddle the event so that we can deliver
        // it, and that no one will try to touch it later.
        pe.event->m_posted = false;
        QEvent *e = pe.event;
        QObject * r = pe.receiver;

        r->d_func()->postedEvents.fetchAndSubAcquire(1);
        Q_ASSERT(r->d_func()->postedEvents >= 0);

        // next, update the data structure so that we're ready
        // for the next event.
        const_cast<QPostEvent &>(pe).event = nullptr;

        locker.unlock();
        const auto relocker = qScopeGuard([&locker] { locker.lock(); });

        const std::unique_ptr<QEvent> event_deleter(e); // will delete the event (with the mutex unlocked)

        // after all that work, it's time to deliver the event.
        QCoreApplication::sendEvent(r, e);

        // careful when adding anything below this point - the
        // sendEvent() call might invalidate any invariants this
        // function depends on.
    }

    cleanup.exceptionCaught = false;
}